

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_dup(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand = Frame::popTopOfOperandStack(this_01);
  if (operand._0_8_ >> 0x20 == 7) {
    __assert_fail("value.type != ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x71d,"void ExecutionEngine::i_dup()");
  }
  if (operand.type != LONG) {
    Frame::pushIntoOperandStack(this_01,operand);
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type != ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x71c,"void ExecutionEngine::i_dup()");
}

Assistant:

void ExecutionEngine::i_dup() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type != ValueType::LONG);
    assert(value.type != ValueType::DOUBLE);

    topFrame->pushIntoOperandStack(value);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}